

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void GlobOpt::MarkNonByteCodeUsed(Opnd *opnd)

{
  OpndKind OVar1;
  RegOpnd *this;
  IndirOpnd *pIVar2;
  
  OVar1 = IR::Opnd::GetKind(opnd);
  if (OVar1 == OpndKindIndir) {
    pIVar2 = IR::Opnd::AsIndirOpnd(opnd);
    IR::Opnd::SetIsJITOptimizedReg(&pIVar2->m_baseOpnd->super_Opnd,true);
    pIVar2 = IR::Opnd::AsIndirOpnd(opnd);
    this = pIVar2->m_indexOpnd;
    if (this == (RegOpnd *)0x0) {
      return;
    }
  }
  else {
    if (OVar1 != OpndKindReg) {
      return;
    }
    this = IR::Opnd::AsRegOpnd(opnd);
  }
  IR::Opnd::SetIsJITOptimizedReg(&this->super_Opnd,true);
  return;
}

Assistant:

void
GlobOpt::MarkNonByteCodeUsed(IR::Opnd * opnd)
{
    switch(opnd->GetKind())
    {
    case IR::OpndKindReg:
        opnd->AsRegOpnd()->SetIsJITOptimizedReg(true);
        break;
    case IR::OpndKindIndir:
        opnd->AsIndirOpnd()->GetBaseOpnd()->SetIsJITOptimizedReg(true);
        {
            IR::RegOpnd * indexOpnd = opnd->AsIndirOpnd()->GetIndexOpnd();
            if (indexOpnd)
            {
                indexOpnd->SetIsJITOptimizedReg(true);
            }
        }
        break;
    }
}